

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Compiler.cpp
# Opt level: O3

char * BuildModuleFromPath(Allocator *allocator,InplaceStr moduleName,char *moduleRoot,
                          bool addExtension,char **errorPos,char *errorBuf,uint errorBufSize,
                          int optimizationLevel,ArrayView<InplaceStr> activeImports,
                          CompilerStatistics *statistics)

{
  long lVar1;
  long lVar2;
  uint uVar3;
  int iVar4;
  char *pcVar5;
  ulong uVar6;
  char *pcVar7;
  char *__haystack;
  undefined7 in_register_00000081;
  uint uVar8;
  ulong uVar9;
  uint fileSize;
  TraceScope traceScope;
  char path [1024];
  char nextModuleRootBuf [1024];
  uint local_86c;
  char *local_868;
  undefined4 local_85c;
  char **local_858;
  Allocator *local_850;
  TraceScope local_848;
  char local_838 [1024];
  char local_438 [1032];
  
  pcVar7 = moduleName.end;
  __haystack = moduleName.begin;
  local_868 = moduleRoot;
  local_850 = allocator;
  if (statistics == (CompilerStatistics *)0x0) {
    NULLC::TraceDump();
  }
  else {
    uVar3 = NULLCTime::clockMicro();
    statistics->startTime = uVar3;
    statistics->finishTime = 0;
    NULLC::TraceDump();
    uVar3 = NULLCTime::clockMicro();
    CompilerStatistics::Finish(statistics,"Tracing",uVar3);
    uVar3 = NULLCTime::clockMicro();
    statistics->startTime = uVar3;
    statistics->finishTime = 0;
  }
  if (BuildModuleFromPath(Allocator*,InplaceStr,char_const*,bool,char_const**,char*,unsigned_int,int,ArrayView<InplaceStr>,CompilerStatistics*)
      ::token == '\0') {
    iVar4 = __cxa_guard_acquire(&BuildModuleFromPath(Allocator*,InplaceStr,char_const*,bool,char_const**,char*,unsigned_int,int,ArrayView<InplaceStr>,CompilerStatistics*)
                                 ::token);
    if (iVar4 != 0) {
      BuildModuleFromPath::token = NULLC::TraceGetToken("compiler","BuildModuleFromPath");
      __cxa_guard_release(&BuildModuleFromPath(Allocator*,InplaceStr,char_const*,bool,char_const**,char*,unsigned_int,int,ArrayView<InplaceStr>,CompilerStatistics*)
                           ::token);
    }
  }
  NULLC::TraceScope::TraceScope(&local_848,BuildModuleFromPath::token);
  lVar2 = NULLC::traceContext;
  uVar9 = (long)pcVar7 - (long)__haystack;
  iVar4 = (int)uVar9;
  if (iVar4 != 0) {
    local_85c = (undefined4)CONCAT71(in_register_00000081,addExtension);
    uVar8 = iVar4 + 1;
    uVar3 = *(uint *)(NULLC::traceContext + 0x264);
    local_858 = errorPos;
    if ((uVar3 <= *(int *)(NULLC::traceContext + 0x260) + uVar8) ||
       (*(int *)(NULLC::traceContext + 0x270) == *(int *)(NULLC::traceContext + 0x274))) {
      NULLC::TraceDump();
      uVar3 = *(uint *)(lVar2 + 0x264);
    }
    if (uVar3 <= uVar8) {
      __assert_fail("count + 1 < context.labels.max",
                    "/workspace/llm4binary/github/license_c_cmakelists/WheretIB[P]nullc/NULLC/Trace.h"
                    ,0x142,"void NULLC::TraceLabel(const char *, const char *)");
    }
    uVar3 = *(uint *)(lVar2 + 0x260);
    memcpy((void *)((ulong)uVar3 + *(long *)(lVar2 + 0x268)),__haystack,uVar9 & 0xffffffff);
    *(undefined1 *)(*(long *)(lVar2 + 0x268) + (ulong)(uint)(*(int *)(lVar2 + 0x260) + iVar4)) = 0;
    *(int *)(lVar2 + 0x260) = *(int *)(lVar2 + 0x260) + uVar8;
    lVar1 = *(long *)(lVar2 + 0x278);
    uVar8 = *(uint *)(lVar2 + 0x270);
    *(uint *)(lVar2 + 0x270) = uVar8 + 1;
    *(uint *)(lVar1 + (ulong)uVar8 * 8) = uVar3 * 4 + 2;
    *(undefined4 *)(lVar1 + 4 + (ulong)uVar8 * 8) = 0;
    addExtension = SUB41(local_85c,0);
    errorPos = local_858;
  }
  if (*pcVar7 != '\0') {
    __assert_fail("*moduleName.end == 0",
                  "/workspace/llm4binary/github/license_c_cmakelists/WheretIB[P]nullc/NULLC/Compiler.cpp"
                  ,0x882,
                  "char *BuildModuleFromPath(Allocator *, InplaceStr, const char *, bool, const char **, char *, unsigned int, int, ArrayView<InplaceStr>, CompilerStatistics *)"
                 );
  }
  pcVar5 = strstr(__haystack,".nc");
  if (addExtension == false) {
    if (pcVar5 == (char *)0x0) {
      __assert_fail("strstr(moduleName.begin, \".nc\") != NULL",
                    "/workspace/llm4binary/github/license_c_cmakelists/WheretIB[P]nullc/NULLC/Compiler.cpp"
                    ,0x887,
                    "char *BuildModuleFromPath(Allocator *, InplaceStr, const char *, bool, const char **, char *, unsigned int, int, ArrayView<InplaceStr>, CompilerStatistics *)"
                   );
    }
  }
  else if (pcVar5 != (char *)0x0) {
    __assert_fail("strstr(moduleName.begin, \".nc\") == NULL",
                  "/workspace/llm4binary/github/license_c_cmakelists/WheretIB[P]nullc/NULLC/Compiler.cpp"
                  ,0x885,
                  "char *BuildModuleFromPath(Allocator *, InplaceStr, const char *, bool, const char **, char *, unsigned int, int, ArrayView<InplaceStr>, CompilerStatistics *)"
                 );
  }
  local_86c = 0;
  if (local_868 != (char *)0x0) {
    pcVar5 = FindFileContentInImportPaths
                       (moduleName,local_868,addExtension,local_838,0x400,&local_86c);
    if (pcVar5 != (char *)0x0) {
      if (__haystack != pcVar7) {
        uVar6 = (ulong)(uint)((int)moduleName.end - (int)moduleName.begin);
        do {
          pcVar7 = pcVar7 + -1;
          if (pcVar7 < __haystack) goto LAB_00138f8f;
          uVar6 = (ulong)((int)uVar6 - 1);
        } while (*pcVar7 != '/');
        NULLC::SafeSprintf(local_438,0x400,"%s/%.*s",local_868,uVar6,__haystack);
        local_868 = local_438;
      }
      goto LAB_00138f8f;
    }
  }
  pcVar5 = FindFileContentInImportPaths
                     (moduleName,(char *)0x0,addExtension,local_838,0x400,&local_86c);
  if (pcVar5 == (char *)0x0) {
    pcVar5 = (char *)0x0;
  }
  else if (__haystack != pcVar7) {
    uVar6 = (ulong)(uint)((int)moduleName.end - (int)moduleName.begin);
    do {
      pcVar7 = pcVar7 + -1;
      if (pcVar7 < __haystack) goto LAB_00138f8f;
      uVar6 = (ulong)((int)uVar6 - 1);
    } while (*pcVar7 != '/');
    local_868 = local_438;
    NULLC::SafeSprintf(local_868,0x400,"%.*s",uVar6,__haystack);
  }
LAB_00138f8f:
  if (statistics != (CompilerStatistics *)0x0) {
    uVar3 = NULLCTime::clockMicro();
    CompilerStatistics::Finish(statistics,"Extra",uVar3);
  }
  if (pcVar5 == (char *)0x0) {
    *errorPos = (char *)0x0;
    if (errorBufSize == 0 || errorBuf == (char *)0x0) {
      pcVar7 = (char *)0x0;
    }
    else {
      pcVar7 = (char *)0x0;
      NULLC::SafeSprintf(errorBuf,(ulong)errorBufSize,
                         "ERROR: module file \'%.*s\' could not be opened",uVar9 & 0xffffffff,
                         __haystack);
    }
  }
  else {
    pcVar7 = BuildModuleFromSource
                       (local_850,local_838,local_868,pcVar5,local_86c,errorPos,errorBuf,
                        errorBufSize,optimizationLevel,activeImports,statistics);
    (*(code *)NULLC::fileFree)(pcVar5);
  }
  NULLC::TraceScope::~TraceScope(&local_848);
  return pcVar7;
}

Assistant:

char* BuildModuleFromPath(Allocator *allocator, InplaceStr moduleName, const char *moduleRoot, bool addExtension, const char **errorPos, char *errorBuf, unsigned errorBufSize, int optimizationLevel, ArrayView<InplaceStr> activeImports, CompilerStatistics *statistics)
{
	if(statistics)
		statistics->Start(NULLCTime::clockMicro());

	NULLC::TraceDump();

	if(statistics)
	{
		statistics->Finish("Tracing", NULLCTime::clockMicro());
		statistics->Start(NULLCTime::clockMicro());
	}

	TRACE_SCOPE("compiler", "BuildModuleFromPath");
	TRACE_LABEL2(moduleName.begin, moduleName.end);

	assert(*moduleName.end == 0);

	if(addExtension)
		assert(strstr(moduleName.begin, ".nc") == NULL);
	else
		assert(strstr(moduleName.begin, ".nc") != NULL);

	const unsigned nextModuleRootLength = 1024;
	char nextModuleRootBuf[nextModuleRootLength];

	const char *nextModuleRoot = moduleRoot;

	const unsigned pathLength = 1024;
	char path[pathLength];

	unsigned fileSize = 0;
	const char *fileContent = NULL;

	if(moduleRoot)
	{
		fileContent = FindFileContentInImportPaths(moduleName, moduleRoot, addExtension, path, pathLength, fileSize);

		if(fileContent)
		{
			if(const char *pos = moduleName.rfind('/'))
			{
				NULLC::SafeSprintf(nextModuleRootBuf, nextModuleRootLength, "%s/%.*s", moduleRoot, unsigned(pos - moduleName.begin), moduleName.begin);

				nextModuleRoot = nextModuleRootBuf;
			}
		}
	}

	if(!fileContent)
	{
		fileContent = FindFileContentInImportPaths(moduleName, NULL, addExtension, path, pathLength, fileSize);

		if(fileContent)
		{
			if(const char *pos = moduleName.rfind('/'))
			{
				NULLC::SafeSprintf(nextModuleRootBuf, nextModuleRootLength, "%.*s", unsigned(pos - moduleName.begin), moduleName.begin);

				nextModuleRoot = nextModuleRootBuf;
			}
		}
	}

	if(statistics)
		statistics->Finish("Extra", NULLCTime::clockMicro());

	if(!fileContent)
	{
		*errorPos = NULL;

		if(errorBuf && errorBufSize)
			NULLC::SafeSprintf(errorBuf, errorBufSize, "ERROR: module file '%.*s' could not be opened", moduleName.length(), moduleName.begin);

		return NULL;
	}

	char *bytecode = BuildModuleFromSource(allocator, path, nextModuleRoot, fileContent, fileSize, errorPos, errorBuf, errorBufSize, optimizationLevel, activeImports, statistics);

	NULLC::fileFree(fileContent);

	return bytecode;
}